

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t * roaring_bitmap_portable_deserialize_safe(char *buf,size_t maxbytes)

{
  _Bool _Var1;
  roaring_array_t *answer;
  size_t bytesread;
  ulong local_20;
  
  answer = (roaring_array_t *)malloc(0x28);
  if (answer != (roaring_array_t *)0x0) {
    _Var1 = ra_portable_deserialize(answer,buf,maxbytes,&local_20);
    if ((_Var1) && (maxbytes < local_20)) {
      __assert_fail("bytesread <= maxbytes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x3fdd,
                    "roaring_bitmap_t *roaring_bitmap_portable_deserialize_safe(const char *, size_t)"
                   );
    }
    answer->flags = answer->flags & 0xfe;
    if (_Var1) {
      return (roaring_bitmap_t *)answer;
    }
    free(answer);
  }
  return (roaring_bitmap_t *)0x0;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_portable_deserialize_safe(const char *buf, size_t maxbytes) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)malloc(sizeof(roaring_bitmap_t));
    if (ans == NULL) {
        return NULL;
    }
    size_t bytesread;
    bool is_ok = ra_portable_deserialize(&ans->high_low_container, buf, maxbytes, &bytesread);
    if(is_ok) assert(bytesread <= maxbytes);
    roaring_bitmap_set_copy_on_write(ans, false);
    if (!is_ok) {
        free(ans);
        return NULL;
    }
    return ans;
}